

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O0

void polyscope::anon_unknown_1::writePrefsFile(void)

{
  _Setw _Var1;
  ostream *this;
  ofstream o;
  json prefsJSON;
  bool valuesValid;
  int windowHeight;
  int windowWidth;
  int posY;
  int posX;
  tuple<int,_int> *in_stack_fffffffffffffaf8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb08;
  ostream *in_stack_fffffffffffffb10;
  value_t in_stack_fffffffffffffb3e;
  undefined1 in_stack_fffffffffffffb3f;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb40;
  initializer_list<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  in_stack_fffffffffffffb48;
  undefined8 **local_418;
  undefined8 **local_400;
  undefined8 **local_3e8;
  undefined8 **local_3d0;
  undefined8 **local_3b8;
  bool local_398;
  bool local_397;
  bool local_396;
  bool local_395;
  ostream local_390 [519];
  undefined1 local_189;
  undefined1 **local_188;
  undefined8 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 **local_160;
  undefined8 local_158;
  undefined1 **local_150;
  undefined8 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 **local_128;
  undefined8 local_120;
  undefined1 **local_118;
  undefined8 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 **local_f0;
  undefined8 local_e8;
  undefined1 **local_d0;
  undefined8 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 **local_a8;
  undefined8 local_a0;
  undefined1 **local_98;
  undefined8 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 **local_50;
  undefined8 local_48;
  undefined1 local_29;
  int local_28;
  int local_24;
  undefined1 local_10 [8];
  uint local_8;
  uint local_4;
  
  (**(code **)(*render::engine + 0xb0))(local_10);
  std::tie<int,int>((int *)in_stack_fffffffffffffb08,(int *)in_stack_fffffffffffffb00);
  std::tuple<int&,int&>::operator=
            ((tuple<int_&,_int_&> *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  local_24 = view::windowWidth;
  local_28 = view::windowHeight;
  local_395 = local_4 < 10000;
  local_396 = local_8 < 10000;
  local_397 = 0x3f < view::windowWidth && view::windowWidth < 10000;
  local_398 = 0x3f < view::windowHeight && view::windowHeight < 10000;
  local_29 = ((local_395 && local_396) && local_397) && local_398;
  if ((bool)local_29) {
    local_189 = 1;
    local_98 = (undefined1 **)local_90;
    local_d0 = (undefined1 **)local_c8;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[12],_char[12],_0>
              (in_stack_fffffffffffffb00,(char (*) [12])in_stack_fffffffffffffaf8);
    local_d0 = (undefined1 **)local_b8;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>(in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8);
    local_a8 = (undefined1 **)local_c8;
    local_a0 = 2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,(bool)in_stack_fffffffffffffb3f
                 ,in_stack_fffffffffffffb3e);
    local_98 = (undefined1 **)local_80;
    local_118 = (undefined1 **)local_110;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[13],_char[13],_0>
              (in_stack_fffffffffffffb00,(char (*) [13])in_stack_fffffffffffffaf8);
    local_118 = (undefined1 **)local_100;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>(in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8);
    local_f0 = (undefined1 **)local_110;
    local_e8 = 2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,(bool)in_stack_fffffffffffffb3f
                 ,in_stack_fffffffffffffb3e);
    local_98 = (undefined1 **)local_70;
    local_150 = (undefined1 **)local_148;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[11],_char[11],_0>
              (in_stack_fffffffffffffb00,(char (*) [11])in_stack_fffffffffffffaf8);
    local_150 = (undefined1 **)local_138;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>(in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8);
    local_128 = (undefined1 **)local_148;
    local_120 = 2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,(bool)in_stack_fffffffffffffb3f
                 ,in_stack_fffffffffffffb3e);
    local_98 = (undefined1 **)local_60;
    local_188 = (undefined1 **)local_180;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[11],_char[11],_0>
              (in_stack_fffffffffffffb00,(char (*) [11])in_stack_fffffffffffffaf8);
    local_188 = (undefined1 **)local_170;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>(in_stack_fffffffffffffb00,(int *)in_stack_fffffffffffffaf8);
    local_160 = (undefined1 **)local_180;
    local_158 = 2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,(bool)in_stack_fffffffffffffb3f
                 ,in_stack_fffffffffffffb3e);
    local_189 = 0;
    local_50 = (undefined1 **)local_90;
    local_48 = 4;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,(bool)in_stack_fffffffffffffb3f
                 ,in_stack_fffffffffffffb3e);
    local_3b8 = &local_50;
    do {
      local_3b8 = local_3b8 + -2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffb00);
    } while (local_3b8 != local_90);
    local_3d0 = &local_160;
    do {
      local_3d0 = local_3d0 + -2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffb00);
    } while (local_3d0 != local_180);
    local_3e8 = &local_128;
    do {
      local_3e8 = local_3e8 + -2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffb00);
    } while (local_3e8 != local_148);
    local_400 = &local_f0;
    do {
      local_400 = local_400 + -2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffb00);
    } while (local_400 != local_110);
    local_418 = &local_a8;
    do {
      local_418 = local_418 + -2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(in_stack_fffffffffffffb00);
    } while (local_418 != local_c8);
    std::ofstream::ofstream
              (local_390,(string *)(anonymous_namespace)::prefsFilename_abi_cxx11_,_S_out);
    _Var1 = std::setw(4);
    std::operator<<(local_390,_Var1);
    this = nlohmann::operator<<(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::ofstream::~ofstream(local_390);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(in_stack_fffffffffffffb00);
  }
  return;
}

Assistant:

void writePrefsFile() {

  // Update values as needed
  int posX, posY;
  std::tie(posX, posY) = render::engine->getWindowPos();
  int windowWidth = view::windowWidth;
  int windowHeight = view::windowHeight;

  // Validate values. Don't write the prefs file if any of these values are obviously bogus (this seems to happen at
  // least on Windows when the application is minimzed)
  bool valuesValid = true;
  valuesValid &= posX >= 0 && posX < 10000;
  valuesValid &= posY >= 0 && posY < 10000;
  valuesValid &= windowWidth >= 64 && windowWidth < 10000;
  valuesValid &= windowHeight >= 64 && windowHeight < 10000;
  if (!valuesValid) return;

  // Build json object
  json prefsJSON = {
      {"windowWidth", windowWidth},
      {"windowHeight", windowHeight},
      {"windowPosX", posX},
      {"windowPosY", posY},
  };

  // Write out json object
  std::ofstream o(prefsFilename);
  o << std::setw(4) << prefsJSON << std::endl;
}